

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_val_t * mpcf_maths(int n,mpc_val_t **xs)

{
  undefined1 *__ptr;
  
  __ptr = (undefined1 *)xs[1];
  switch(*__ptr) {
  case 0x25:
    *(int *)*xs = **xs % *xs[2];
    break;
  case 0x2a:
    *(int *)*xs = **xs * *xs[2];
    break;
  case 0x2b:
    *(int *)*xs = **xs + *xs[2];
    break;
  case 0x2d:
    *(int *)*xs = **xs - *xs[2];
    break;
  case 0x2f:
    *(int *)*xs = **xs / *xs[2];
  }
  free(__ptr);
  free(xs[2]);
  return *xs;
}

Assistant:

mpc_val_t *mpcf_maths(int n, mpc_val_t **xs) {
  int **vs = (int**)xs;
  (void) n;

  switch(((char*)xs[1])[0])
  {
    case '*': { *vs[0] *= *vs[2]; }; break;
    case '/': { *vs[0] /= *vs[2]; }; break;
    case '%': { *vs[0] %= *vs[2]; }; break;
    case '+': { *vs[0] += *vs[2]; }; break;
    case '-': { *vs[0] -= *vs[2]; }; break;
    default: break;
  }

  free(xs[1]); free(xs[2]);

  return xs[0];
}